

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_2_12_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  int i;
  int iVar23;
  int iVar24;
  int col;
  int col_00;
  int col_01;
  int col_02;
  int col_03;
  int col_04;
  int col_05;
  int col_06;
  int col_07;
  int col_08;
  int col_09;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  int col_10;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  float *pfVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  float *pfVar40;
  float *pfVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar85 [12];
  undefined1 auVar84 [64];
  float fVar86;
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [64];
  
  auVar50._8_4_ = 0x3effffff;
  auVar50._0_8_ = 0x3effffff3effffff;
  auVar50._12_4_ = 0x3effffff;
  auVar49._8_4_ = 0x80000000;
  auVar49._0_8_ = 0x8000000080000000;
  auVar49._12_4_ = 0x80000000;
  fVar57 = ipoint->scale;
  auVar90 = ZEXT464((uint)fVar57);
  auVar46 = ZEXT816(0x3fe0000000000000);
  auVar84 = ZEXT1664(auVar46);
  auVar51 = ZEXT416((uint)fVar57);
  auVar42 = vpternlogd_avx512vl(auVar50,auVar51,auVar49,0xf8);
  auVar42 = ZEXT416((uint)(fVar57 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  fVar55 = -0.08 / (fVar57 * fVar57);
  iVar29 = (int)auVar42._0_4_;
  auVar43._0_4_ = (int)auVar42._0_4_;
  auVar43._4_4_ = (int)auVar42._4_4_;
  auVar43._8_4_ = (int)auVar42._8_4_;
  auVar43._12_4_ = (int)auVar42._12_4_;
  auVar42 = vcvtdq2ps_avx(auVar43);
  auVar43 = vpternlogd_avx512vl(auVar50,ZEXT416((uint)ipoint->x),auVar49,0xf8);
  auVar43 = ZEXT416((uint)(ipoint->x + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44._0_8_ = (double)auVar43._0_4_;
  auVar44._8_8_ = auVar43._8_8_;
  auVar48._0_8_ = (double)fVar57;
  auVar48._8_8_ = 0;
  auVar43 = vfmadd231sd_fma(auVar44,auVar48,auVar46);
  auVar47._0_4_ = (float)auVar43._0_8_;
  auVar47._4_12_ = auVar43._4_12_;
  auVar43 = vpternlogd_avx512vl(auVar50,ZEXT416((uint)ipoint->y),auVar49,0xf8);
  fVar3 = auVar47._0_4_ - auVar42._0_4_;
  auVar43 = ZEXT416((uint)(ipoint->y + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = ZEXT416((uint)fVar3);
  auVar45._0_8_ = (double)auVar43._0_4_;
  auVar45._8_8_ = auVar43._8_8_;
  auVar43 = vfmadd231sd_fma(auVar45,auVar48,auVar46);
  auVar46._0_4_ = (float)auVar43._0_8_;
  auVar46._4_12_ = auVar43._4_12_;
  fVar89 = auVar46._0_4_ - auVar42._0_4_;
  auVar45 = ZEXT416((uint)fVar57);
  auVar42 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar45,auVar47);
  auVar43 = vpternlogd_avx512vl(auVar50,auVar42,auVar49,0xf8);
  auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  if (iVar29 < (int)auVar42._0_4_) {
    auVar52._8_4_ = 0x3effffff;
    auVar52._0_8_ = 0x3effffff3effffff;
    auVar52._12_4_ = 0x3effffff;
    auVar53._8_4_ = 0x80000000;
    auVar53._0_8_ = 0x8000000080000000;
    auVar53._12_4_ = 0x80000000;
    auVar42 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar45,auVar46);
    auVar43 = vpternlogd_avx512vl(auVar53,auVar42,auVar52,0xea);
    auVar83 = ZEXT1664(auVar43);
    auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
    auVar42 = vroundss_avx(auVar42,auVar42,0xb);
    if (iVar29 < (int)auVar42._0_4_) {
      auVar42 = vfmadd231ss_fma(auVar47,auVar45,ZEXT416(0x41300000));
      auVar77._8_4_ = 0x80000000;
      auVar77._0_8_ = 0x8000000080000000;
      auVar77._12_4_ = 0x80000000;
      auVar43 = vpternlogd_avx512vl(auVar77,auVar42,auVar52,0xea);
      auVar81 = ZEXT1664(auVar43);
      auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
      auVar42 = vroundss_avx(auVar42,auVar42,0xb);
      if ((int)auVar42._0_4_ + iVar29 <= iimage->width) {
        auVar42 = vfmadd231ss_fma(auVar46,auVar45,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar43 = vpternlogd_avx512vl(auVar52,auVar42,auVar13,0xf8);
        auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
        auVar42 = vroundss_avx(auVar42,auVar42,0xb);
        if ((int)auVar42._0_4_ + iVar29 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          lVar39 = 0x60;
          for (uVar26 = 0xfffffff4; (int)uVar26 < 0xc; uVar26 = uVar26 + 2) {
            auVar42._0_4_ = (float)(int)uVar26;
            auVar42._4_12_ = in_ZMM8._4_12_;
            auVar42 = vfmadd213ss_fma(auVar42,auVar90._0_16_,ZEXT416((uint)(fVar89 + 0.5)));
            iVar24 = (int)auVar42._0_4_;
            auVar59._0_4_ = (float)(int)(uVar26 | 1);
            auVar59._4_12_ = in_ZMM8._4_12_;
            auVar42 = vfmadd213ss_fma(auVar59,auVar90._0_16_,ZEXT416((uint)(fVar89 + 0.5)));
            iVar23 = (int)auVar42._0_4_;
            lVar38 = lVar39;
            for (iVar25 = -0xc; iVar25 < 0xc; iVar25 = iVar25 + 0xc) {
              auVar60._0_4_ = (float)iVar25;
              auVar60._4_12_ = in_ZMM8._4_12_;
              auVar42 = vfmadd213ss_fma(auVar60,auVar51,ZEXT416((uint)fVar3));
              auVar61._0_4_ = (float)(iVar25 + 1);
              auVar85 = auVar84._4_12_;
              auVar61._4_12_ = auVar85;
              auVar43 = vfmadd213ss_fma(auVar61,auVar51,ZEXT416((uint)fVar3));
              auVar62._0_4_ = (float)(iVar25 + 2);
              auVar62._4_12_ = auVar85;
              auVar47 = ZEXT416((uint)fVar3);
              auVar44 = vfmadd213ss_fma(auVar62,auVar51,auVar47);
              auVar63._0_4_ = (float)(iVar25 + 3);
              auVar63._4_12_ = auVar85;
              auVar45 = vfmadd213ss_fma(auVar63,auVar51,auVar47);
              auVar64._0_4_ = (float)(iVar25 + 4);
              auVar64._4_12_ = auVar85;
              auVar46 = vfmadd213ss_fma(auVar64,auVar51,auVar47);
              auVar65._0_4_ = (float)(iVar25 + 5);
              auVar65._4_12_ = auVar85;
              auVar47 = vfmadd213ss_fma(auVar65,auVar51,auVar47);
              auVar66._0_4_ = (float)(iVar25 + 6);
              auVar66._4_12_ = auVar85;
              auVar77 = ZEXT416((uint)fVar3);
              auVar48 = vfmadd213ss_fma(auVar66,auVar51,auVar77);
              auVar67._0_4_ = (float)(iVar25 + 7);
              auVar67._4_12_ = auVar85;
              auVar49 = vfmadd213ss_fma(auVar67,auVar51,auVar77);
              auVar68._0_4_ = (float)(iVar25 + 8);
              auVar68._4_12_ = auVar85;
              auVar50 = vfmadd213ss_fma(auVar68,auVar51,auVar77);
              auVar69._0_4_ = (float)(iVar25 + 9);
              auVar69._4_12_ = auVar83._4_12_;
              auVar52 = vfmadd213ss_fma(auVar69,auVar51,auVar77);
              auVar70._0_4_ = (float)(iVar25 + 10);
              auVar70._4_12_ = auVar83._4_12_;
              auVar53 = vfmadd213ss_fma(auVar70,auVar51,auVar77);
              auVar71._0_4_ = (float)(iVar25 + 0xb);
              auVar71._4_12_ = auVar81._4_12_;
              auVar77 = vfmadd213ss_fma(auVar71,auVar51,auVar77);
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar42._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x60),
                         (float *)((long)haarResponseY + lVar38 + -0x60));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar43._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x5c),
                         (float *)((long)haarResponseY + lVar38 + -0x5c));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar44._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x58),
                         (float *)((long)haarResponseY + lVar38 + -0x58));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar45._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x54),
                         (float *)((long)haarResponseY + lVar38 + -0x54));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar46._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x50),
                         (float *)((long)haarResponseY + lVar38 + -0x50));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar47._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x4c),
                         (float *)((long)haarResponseY + lVar38 + -0x4c));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar48._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x48),
                         (float *)((long)haarResponseY + lVar38 + -0x48));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar49._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x44),
                         (float *)((long)haarResponseY + lVar38 + -0x44));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar50._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x40),
                         (float *)((long)haarResponseY + lVar38 + -0x40));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar52._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x3c),
                         (float *)((long)haarResponseY + lVar38 + -0x3c));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar53._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x38),
                         (float *)((long)haarResponseY + lVar38 + -0x38));
              haarXY_unconditional
                        (iimage,iVar24,(int)auVar77._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + -0x34),
                         (float *)((long)haarResponseY + lVar38 + -0x34));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar42._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38),
                         (float *)((long)haarResponseY + lVar38));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar43._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 4),
                         (float *)((long)haarResponseY + lVar38 + 4));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar44._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 8),
                         (float *)((long)haarResponseY + lVar38 + 8));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar45._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0xc),
                         (float *)((long)haarResponseY + lVar38 + 0xc));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar46._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x10),
                         (float *)((long)haarResponseY + lVar38 + 0x10));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar47._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x14),
                         (float *)((long)haarResponseY + lVar38 + 0x14));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar48._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x18),
                         (float *)((long)haarResponseY + lVar38 + 0x18));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar49._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x1c),
                         (float *)((long)haarResponseY + lVar38 + 0x1c));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar50._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x20),
                         (float *)((long)haarResponseY + lVar38 + 0x20));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar52._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x24),
                         (float *)((long)haarResponseY + lVar38 + 0x24));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar53._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x28),
                         (float *)((long)haarResponseY + lVar38 + 0x28));
              haarXY_unconditional
                        (iimage,iVar23,(int)auVar77._0_4_,iVar29,
                         (float *)((long)haarResponseX + lVar38 + 0x2c),
                         (float *)((long)haarResponseY + lVar38 + 0x2c));
              lVar38 = lVar38 + 0x30;
            }
            auVar90 = ZEXT1664(auVar51);
            lVar39 = lVar39 + 0xc0;
          }
          goto LAB_0017364f;
        }
      }
    }
  }
  lVar39 = 0x60;
  for (uVar26 = 0xfffffff4; (int)uVar26 < 0xc; uVar26 = uVar26 + 2) {
    auVar58._0_4_ = (float)(int)uVar26;
    auVar58._4_12_ = in_ZMM8._4_12_;
    auVar42 = vfmadd213ss_fma(auVar58,auVar90._0_16_,ZEXT416((uint)fVar89));
    auVar73._0_4_ = (float)(int)(uVar26 | 1);
    auVar73._4_12_ = in_ZMM8._4_12_;
    fVar56 = auVar42._0_4_;
    auVar42 = vfmadd213ss_fma(auVar73,auVar90._0_16_,ZEXT416((uint)fVar89));
    fVar72 = auVar42._0_4_;
    iVar23 = (int)((double)((ulong)(0.0 <= fVar56) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar56) * -0x4020000000000000) + (double)fVar56);
    iVar24 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
    lVar38 = lVar39;
    for (iVar25 = -0xc; iVar25 < 0xc; iVar25 = iVar25 + 0xc) {
      auVar54 = vpbroadcastd_avx512vl();
      auVar54 = vpaddd_avx2(auVar54,_DAT_002716c0);
      auVar74._0_4_ = (float)iVar25;
      auVar85 = in_ZMM9._4_12_;
      auVar74._4_12_ = auVar85;
      auVar42 = vfmadd213ss_fma(auVar74,auVar51,auVar44);
      auVar76._0_4_ = (float)(iVar25 + 1);
      auVar76._4_12_ = auVar85;
      auVar43 = vfmadd213ss_fma(auVar76,auVar51,auVar44);
      auVar79._0_4_ = (float)(iVar25 + 2);
      auVar79._4_12_ = auVar85;
      auVar45 = vfmadd213ss_fma(auVar79,auVar51,auVar44);
      auVar82._0_4_ = (float)(iVar25 + 3);
      auVar82._4_12_ = auVar85;
      auVar46 = vfmadd213ss_fma(auVar82,auVar51,auVar44);
      fVar56 = auVar42._0_4_;
      fVar72 = auVar43._0_4_;
      fVar78 = auVar45._0_4_;
      col_10 = (int)((double)((ulong)(0.0 <= fVar56) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar56) * -0x4020000000000000) + (double)fVar56);
      col = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                          (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      fVar56 = auVar46._0_4_;
      col_00 = (int)((double)((ulong)(0.0 <= fVar78) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar78) * -0x4020000000000000) + (double)fVar78);
      auVar54 = vcvtdq2ps_avx(auVar54);
      col_01 = (int)((double)((ulong)(0.0 <= fVar56) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar56) * -0x4020000000000000) + (double)fVar56);
      auVar20._4_4_ = fVar3;
      auVar20._0_4_ = fVar3;
      auVar20._8_4_ = fVar3;
      auVar20._12_4_ = fVar3;
      auVar20._16_4_ = fVar3;
      auVar20._20_4_ = fVar3;
      auVar20._24_4_ = fVar3;
      auVar20._28_4_ = fVar3;
      auVar21._4_4_ = fVar57;
      auVar21._0_4_ = fVar57;
      auVar21._8_4_ = fVar57;
      auVar21._12_4_ = fVar57;
      auVar21._16_4_ = fVar57;
      auVar21._20_4_ = fVar57;
      auVar21._24_4_ = fVar57;
      auVar21._28_4_ = fVar57;
      auVar43 = vfmadd132ps_fma(auVar54,auVar20,auVar21);
      uVar28 = vcmpps_avx512vl(ZEXT1632(auVar43),_DAT_002716e0,0xd);
      auVar42 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      bVar15 = (byte)(uVar28 >> 6);
      bVar16 = (byte)(uVar28 >> 5);
      bVar17 = (byte)(uVar28 >> 4);
      bVar18 = (byte)(uVar28 >> 3);
      bVar19 = (byte)(uVar28 >> 2);
      bVar22 = (byte)(uVar28 >> 1);
      bVar12 = (bool)((byte)(uVar28 >> 7) & 1);
      col_02 = (int)((double)((ulong)bVar12 * 0x3fe0000000000000 +
                             (ulong)!bVar12 * -0x4020000000000000) + (double)auVar42._0_4_);
      auVar42 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      col_03 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) +
                    (double)auVar42._0_4_);
      auVar42 = vmovshdup_avx((undefined1  [16])0x0);
      col_04 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) +
                    (double)auVar42._0_4_);
      col_05 = (int)((double)((ulong)(bVar17 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar17 & 1) * -0x4020000000000000) + 0.0);
      auVar42 = vshufps_avx(auVar43,auVar43,0xff);
      col_06 = (int)((double)((ulong)(bVar18 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar18 & 1) * -0x4020000000000000) +
                    (double)auVar42._0_4_);
      auVar42 = vshufpd_avx(auVar43,auVar43,1);
      col_07 = (int)((double)((ulong)(bVar19 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar19 & 1) * -0x4020000000000000) +
                    (double)auVar42._0_4_);
      auVar42 = vmovshdup_avx(auVar43);
      col_08 = (int)((double)((ulong)(bVar22 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar22 & 1) * -0x4020000000000000) +
                    (double)auVar42._0_4_);
      col_09 = (int)((double)((ulong)((byte)uVar28 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)((byte)uVar28 & 1) * -0x4020000000000000) +
                    (double)auVar43._0_4_);
      in_ZMM8 = ZEXT1664(ZEXT816(0xbfe0000000000000));
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      haarXY_precheck_boundaries
                (iimage,iVar23,col_10,iVar29,(float *)((long)haarResponseX + lVar38 + -0x60),
                 (float *)((long)haarResponseY + lVar38 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar23,col,iVar29,(float *)((long)haarResponseX + lVar38 + -0x5c),
                 (float *)((long)haarResponseY + lVar38 + -0x5c));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_00,iVar29,(float *)((long)haarResponseX + lVar38 + -0x58),
                 (float *)((long)haarResponseY + lVar38 + -0x58));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_01,iVar29,(float *)((long)haarResponseX + lVar38 + -0x54),
                 (float *)((long)haarResponseY + lVar38 + -0x54));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_02,iVar29,(float *)((long)haarResponseX + lVar38 + -0x50),
                 (float *)((long)haarResponseY + lVar38 + -0x50));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_03,iVar29,(float *)((long)haarResponseX + lVar38 + -0x4c),
                 (float *)((long)haarResponseY + lVar38 + -0x4c));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_04,iVar29,(float *)((long)haarResponseX + lVar38 + -0x48),
                 (float *)((long)haarResponseY + lVar38 + -0x48));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_05,iVar29,(float *)((long)haarResponseX + lVar38 + -0x44),
                 (float *)((long)haarResponseY + lVar38 + -0x44));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_06,iVar29,(float *)((long)haarResponseX + lVar38 + -0x40),
                 (float *)((long)haarResponseY + lVar38 + -0x40));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_07,iVar29,(float *)((long)haarResponseX + lVar38 + -0x3c),
                 (float *)((long)haarResponseY + lVar38 + -0x3c));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_08,iVar29,(float *)((long)haarResponseX + lVar38 + -0x38),
                 (float *)((long)haarResponseY + lVar38 + -0x38));
      haarXY_precheck_boundaries
                (iimage,iVar23,col_09,iVar29,(float *)((long)haarResponseX + lVar38 + -0x34),
                 (float *)((long)haarResponseY + lVar38 + -0x34));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_10,iVar29,(float *)((long)haarResponseX + lVar38),
                 (float *)((long)haarResponseY + lVar38));
      haarXY_precheck_boundaries
                (iimage,iVar24,col,iVar29,(float *)((long)haarResponseX + lVar38 + 4),
                 (float *)((long)haarResponseY + lVar38 + 4));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_00,iVar29,(float *)((long)haarResponseX + lVar38 + 8),
                 (float *)((long)haarResponseY + lVar38 + 8));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_01,iVar29,(float *)((long)haarResponseX + lVar38 + 0xc),
                 (float *)((long)haarResponseY + lVar38 + 0xc));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_02,iVar29,(float *)((long)haarResponseX + lVar38 + 0x10),
                 (float *)((long)haarResponseY + lVar38 + 0x10));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_03,iVar29,(float *)((long)haarResponseX + lVar38 + 0x14),
                 (float *)((long)haarResponseY + lVar38 + 0x14));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_04,iVar29,(float *)((long)haarResponseX + lVar38 + 0x18),
                 (float *)((long)haarResponseY + lVar38 + 0x18));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_05,iVar29,(float *)((long)haarResponseX + lVar38 + 0x1c),
                 (float *)((long)haarResponseY + lVar38 + 0x1c));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_06,iVar29,(float *)((long)haarResponseX + lVar38 + 0x20),
                 (float *)((long)haarResponseY + lVar38 + 0x20));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_07,iVar29,(float *)((long)haarResponseX + lVar38 + 0x24),
                 (float *)((long)haarResponseY + lVar38 + 0x24));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_08,iVar29,(float *)((long)haarResponseX + lVar38 + 0x28),
                 (float *)((long)haarResponseY + lVar38 + 0x28));
      haarXY_precheck_boundaries
                (iimage,iVar24,col_09,iVar29,(float *)((long)haarResponseX + lVar38 + 0x2c),
                 (float *)((long)haarResponseY + lVar38 + 0x2c));
      lVar38 = lVar38 + 0x30;
    }
    auVar90 = ZEXT1664(auVar51);
    lVar39 = lVar39 + 0xc0;
  }
LAB_0017364f:
  fVar89 = auVar90._0_4_;
  auVar88._8_4_ = 0x3effffff;
  auVar88._0_8_ = 0x3effffff3effffff;
  auVar88._12_4_ = 0x3effffff;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar42 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 0.5)),auVar87,0xf8);
  auVar42 = ZEXT416((uint)(fVar89 * 0.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 1.5)),auVar87,0xf8);
  auVar43 = ZEXT416((uint)(fVar89 * 1.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 2.5)),auVar87,0xf8);
  auVar44 = ZEXT416((uint)(fVar89 * 2.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 3.5)),auVar87,0xf8);
  auVar45 = ZEXT416((uint)(fVar89 * 3.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 4.5)),auVar87,0xf8);
  auVar46 = ZEXT416((uint)(fVar89 * 4.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 5.5)),auVar87,0xf8);
  auVar47 = ZEXT416((uint)(fVar89 * 5.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 6.5)),auVar87,0xf8);
  auVar48 = ZEXT416((uint)(fVar89 * 6.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 7.5)),auVar87,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + fVar89 * 7.5));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 8.5)),auVar87,0xf8);
  auVar50 = ZEXT416((uint)(fVar89 * 8.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 9.5)),auVar87,0xf8);
  auVar51 = ZEXT416((uint)(fVar89 * 9.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 10.5)),auVar87,0xf8);
  auVar52 = ZEXT416((uint)(fVar89 * 10.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 11.5)),auVar87,0xf8);
  fVar75 = auVar44._0_4_;
  fVar57 = fVar75 + auVar43._0_4_;
  fVar3 = fVar75 + auVar42._0_4_;
  auVar44 = ZEXT416((uint)(fVar89 * 11.5 + auVar53._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  fVar89 = fVar75 - auVar42._0_4_;
  fVar56 = fVar75 - auVar43._0_4_;
  fVar72 = fVar75 - auVar45._0_4_;
  fVar78 = fVar75 - auVar46._0_4_;
  fVar4 = fVar75 - auVar47._0_4_;
  fVar75 = fVar75 - auVar48._0_4_;
  fVar86 = auVar49._0_4_;
  fVar5 = fVar86 - auVar45._0_4_;
  fVar6 = fVar86 - auVar46._0_4_;
  fVar7 = fVar86 - auVar47._0_4_;
  fVar8 = fVar86 - auVar48._0_4_;
  fVar9 = fVar86 - auVar50._0_4_;
  fVar10 = fVar86 - auVar51._0_4_;
  fVar11 = fVar86 - auVar52._0_4_;
  fVar86 = fVar86 - auVar44._0_4_;
  gauss_s1_c0[0] = expf(fVar57 * fVar57 * fVar55);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar55);
  gauss_s1_c0[2] = expf(fVar89 * fVar89 * fVar55);
  gauss_s1_c0[3] = expf(fVar56 * fVar56 * fVar55);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar72 * fVar72 * fVar55);
  gauss_s1_c0[6] = expf(fVar78 * fVar78 * fVar55);
  gauss_s1_c0[7] = expf(fVar4 * fVar4 * fVar55);
  gauss_s1_c0[8] = expf(fVar75 * fVar75 * fVar55);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar55);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar55);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar55);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar55);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar55);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar55);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar55);
  gauss_s1_c1[8] = expf(fVar86 * fVar86 * fVar55);
  auVar84 = ZEXT1264(ZEXT812(0));
  lVar39 = 0;
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  iVar29 = 0;
  lVar38 = 0;
  uVar28 = 0xfffffffffffffff8;
  while (uVar26 = (uint)uVar28, (int)uVar26 < 8) {
    pfVar40 = gauss_s1_c1;
    if (uVar26 != 7) {
      pfVar40 = gauss_s1_c0;
    }
    lVar37 = (long)iVar29;
    lVar38 = (long)(int)lVar38;
    iVar29 = iVar29 + 4;
    if (uVar26 == 0xfffffff8) {
      pfVar40 = gauss_s1_c1;
    }
    uVar30 = 0;
    uVar35 = 0xfffffffffffffff8;
    lVar31 = lVar39;
    while (lVar37 != iVar29) {
      pfVar41 = gauss_s1_c1;
      iVar25 = (int)uVar35;
      if (iVar25 != 7) {
        pfVar41 = gauss_s1_c0;
      }
      auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar35 = (ulong)((uint)(uVar35 >> 0x1c) & 8);
      if (iVar25 == -8) {
        pfVar41 = gauss_s1_c1;
      }
      lVar32 = (long)haarResponseX + lVar31;
      lVar33 = (long)haarResponseY + lVar31;
      for (uVar27 = uVar30; uVar27 < iVar25 * 0x18 + 0x198; uVar27 = uVar27 + 0x18) {
        lVar34 = 0;
        pfVar36 = (float *)((long)pfVar40 + (ulong)(((uint)(uVar28 >> 0x1f) & 1) << 5));
        while (lVar34 != 9) {
          fVar57 = *pfVar36;
          pfVar36 = pfVar36 + (ulong)(~uVar26 >> 0x1f) * 2 + -1;
          lVar1 = lVar34 * 4;
          lVar2 = lVar34 * 4;
          lVar34 = lVar34 + 1;
          auVar44 = ZEXT416((uint)(pfVar41[uVar35] * fVar57 * *(float *)(lVar32 + lVar2)));
          auVar42 = vandps_avx(auVar44,auVar51);
          auVar45 = ZEXT416((uint)(pfVar41[uVar35] * fVar57 * *(float *)(lVar33 + lVar1)));
          auVar43 = vandps_avx(auVar45,auVar51);
          auVar44 = vinsertps_avx(auVar45,auVar44,0x10);
          auVar43 = vmovlhps_avx(auVar44,auVar43);
          auVar42 = vinsertps_avx(auVar43,auVar42,0x30);
          auVar90 = ZEXT1664(CONCAT412(auVar90._12_4_ + auVar42._12_4_,
                                       CONCAT48(auVar90._8_4_ + auVar42._8_4_,
                                                CONCAT44(auVar90._4_4_ + auVar42._4_4_,
                                                         auVar90._0_4_ + auVar42._0_4_))));
        }
        uVar35 = uVar35 + (ulong)(-1 < iVar25) * 2 + -1;
        lVar32 = lVar32 + 0x60;
        lVar33 = lVar33 + 0x60;
      }
      uVar35 = (ulong)(iVar25 + 5);
      uVar30 = uVar30 + 0x78;
      lVar31 = lVar31 + 0x1e0;
      fVar57 = gauss_s2_arr[lVar37];
      auVar14._4_4_ = fVar57;
      auVar14._0_4_ = fVar57;
      auVar14._8_4_ = fVar57;
      auVar14._12_4_ = fVar57;
      auVar45 = vmulps_avx512vl(auVar90._0_16_,auVar14);
      lVar37 = lVar37 + 1;
      auVar80._0_4_ = auVar45._0_4_ * auVar45._0_4_;
      auVar80._4_4_ = auVar45._4_4_ * auVar45._4_4_;
      auVar80._8_4_ = auVar45._8_4_ * auVar45._8_4_;
      auVar80._12_4_ = auVar45._12_4_ * auVar45._12_4_;
      auVar43 = vshufpd_avx(auVar45,auVar45,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar38) = auVar45;
      lVar38 = lVar38 + 4;
      auVar42 = vmovshdup_avx(auVar80);
      auVar44 = vfmadd231ss_fma(auVar42,auVar45,auVar45);
      auVar42 = vshufps_avx(auVar45,auVar45,0xff);
      auVar43 = vfmadd213ss_fma(auVar43,auVar43,auVar44);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar43);
      auVar84 = ZEXT464((uint)(auVar84._0_4_ + auVar42._0_4_));
    }
    lVar39 = lVar39 + 0x14;
    uVar28 = (ulong)(uVar26 + 5);
  }
  if (auVar84._0_4_ < 0.0) {
    fVar57 = sqrtf(auVar84._0_4_);
  }
  else {
    auVar42 = vsqrtss_avx(auVar84._0_16_,auVar84._0_16_);
    fVar57 = auVar42._0_4_;
  }
  for (lVar39 = 0; lVar39 != 0x40; lVar39 = lVar39 + 1) {
    ipoint->descriptor[lVar39] = (1.0 / fVar57) * ipoint->descriptor[lVar39];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}